

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nstime.c
# Opt level: O1

void nstime_update_impl(nstime_t *time)

{
  ulong uVar1;
  ulong uVar2;
  timespec ts;
  timespec local_28;
  
  uVar1 = time->ns;
  clock_gettime(6,&local_28);
  uVar2 = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
  time->ns = uVar2;
  if (uVar2 < uVar1) {
    time->ns = uVar1;
  }
  return;
}

Assistant:

static void
nstime_update_impl(nstime_t *time) {
	nstime_t old_time;

	nstime_copy(&old_time, time);
	nstime_get(time);

	/* Handle non-monotonic clocks. */
	if (unlikely(nstime_compare(&old_time, time) > 0)) {
		nstime_copy(time, &old_time);
	}
}